

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O1

bool __thiscall
PType::AddConversion
          (PType *this,PType *target,
          _func_void_ZCC_ExprConstant_ptr_FSharedStringArena_ptr *convertconst)

{
  uint uVar1;
  Conversion *pCVar2;
  uint uVar3;
  bool bVar4;
  
  uVar1 = (this->Conversions).Count;
  bVar4 = uVar1 == 0;
  if (!bVar4) {
    pCVar2 = (this->Conversions).Array;
    if (pCVar2->TargetType != target) {
      uVar3 = 0;
      do {
        pCVar2 = pCVar2 + 1;
        if (uVar1 - 1 == uVar3) {
          bVar4 = true;
          goto LAB_00377ec1;
        }
        uVar3 = uVar3 + 1;
      } while (pCVar2->TargetType != target);
      bVar4 = uVar1 <= uVar3;
    }
    if (bVar4 == false) {
      return false;
    }
  }
LAB_00377ec1:
  TArray<PType::Conversion,_PType::Conversion>::Grow(&this->Conversions,1);
  pCVar2 = (this->Conversions).Array;
  uVar1 = (this->Conversions).Count;
  pCVar2[uVar1].TargetType = target;
  pCVar2[uVar1].ConvertConstant = convertconst;
  (this->Conversions).Count = uVar1 + 1;
  return bVar4;
}

Assistant:

bool PType::AddConversion(PType *target, void (*convertconst)(ZCC_ExprConstant *, class FSharedStringArena &))
{
	// Make sure a conversion hasn't already been registered
	for (unsigned i = 0; i < Conversions.Size(); ++i)
	{
		if (Conversions[i].TargetType == target)
			return false;
	}
	Conversions.Push(Conversion(target, convertconst));
	return true;
}